

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O0

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,TableArrayField *field,void *data)

{
  int iVar1;
  int line;
  Instruction line_00;
  Function *pFVar2;
  CodeGenerateVisitor *in_RDX;
  CodeGenerateVisitor *in_RSI;
  CodeGenerateVisitor *in_RDI;
  Instruction instruction;
  int key_register;
  Function *function;
  int table_register;
  TableFieldData *field_data;
  OpType in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  
  uVar3 = *(undefined4 *)&(in_RDX->super_Visitor)._vptr_Visitor;
  pFVar2 = GetCurrentFunction(in_RDI);
  line = GenerateRegisterId(in_RSI);
  line_00 = Instruction::ACode(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
  Function::AddInstruction
            ((Function *)CONCAT44(line,line_00.opcode_),(Instruction)(uint)((ulong)pFVar2 >> 0x20),
             line_00.opcode_);
  iVar1 = *(int *)((long)&(in_RDX->super_Visitor)._vptr_Visitor + 4);
  *(int *)((long)&(in_RDX->super_Visitor)._vptr_Visitor + 4) = iVar1 + 1;
  Function::AddInstruction
            ((Function *)CONCAT44(line,iVar1),(Instruction)(uint)((ulong)pFVar2 >> 0x20),
             line_00.opcode_);
  SetTableFieldValue<luna::TableArrayField>
            (in_RDX,(TableArrayField *)CONCAT44(uVar3,in_stack_ffffffffffffffd8),
             (int)((ulong)pFVar2 >> 0x20),(int)pFVar2,line);
  return;
}

Assistant:

void CodeGenerateVisitor::Visit(TableArrayField *field, void *data)
    {
        auto field_data = static_cast<TableFieldData *>(data);
        auto table_register = field_data->table_register_;

        // Load key
        auto function = GetCurrentFunction();
        auto key_register = GenerateRegisterId();
        auto instruction = Instruction::ACode(OpType_LoadInt, key_register);
        function->AddInstruction(instruction, field->line_);
        instruction.opcode_ = field_data->array_index_++;
        function->AddInstruction(instruction, field->line_);

        SetTableFieldValue(field, table_register, key_register, field->line_);
    }